

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O1

int dlep_writer_finish_signal(dlep_writer *writer,oonf_log_source source)

{
  uint16_t uVar1;
  autobuf *paVar2;
  undefined8 uVar3;
  ushort uVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  
  paVar2 = writer->out;
  if (paVar2->_error == true) {
    iVar5 = -1;
    if (((&log_global_mask)[source] & 4) == 0) {
      return -1;
    }
    uVar1 = writer->signal_type;
    pcVar9 = "Could not build signal: %u";
    uVar6 = 4;
    uVar3 = 0x79;
    pcVar7 = (char *)0x0;
    uVar8 = 0;
  }
  else {
    uVar8 = paVar2->_len - writer->signal_start;
    if (0x10003 < uVar8) {
      if (((&log_global_mask)[source] & 4) == 0) {
        return -1;
      }
      oonf_log(4,source,"src/generic/dlep/dlep_writer.c",0x80,0,0,"Signal %u became too long: %zu",
               writer->signal_type,paVar2->_len);
      return -1;
    }
    uVar4 = (short)uVar8 - 4;
    pcVar7 = paVar2->_buf;
    *(ushort *)(pcVar7 + writer->signal_start + 2) = uVar4 * 0x100 | uVar4 >> 8;
    if (((&log_global_mask)[source] & 1) == 0) {
      return 0;
    }
    pcVar7 = pcVar7 + writer->signal_start;
    uVar1 = writer->signal_type;
    pcVar9 = "Finished signal %u:";
    iVar5 = 0;
    uVar6 = 1;
    uVar3 = 0x8b;
  }
  oonf_log(uVar6,source,"src/generic/dlep/dlep_writer.c",uVar3,pcVar7,uVar8,pcVar9,uVar1);
  return iVar5;
}

Assistant:

int
dlep_writer_finish_signal(struct dlep_writer *writer, enum oonf_log_source source) {
  size_t length;
  uint16_t tmp16;
  char *dst;

  if (abuf_has_failed(writer->out)) {
    OONF_WARN(source, "Could not build signal: %u", writer->signal_type);
    return -1;
  }

  length = abuf_getlen(writer->out) - writer->signal_start;
  if (length > 65535 + 4) {
    OONF_WARN(
      source, "Signal %u became too long: %" PRINTF_SIZE_T_SPECIFIER, writer->signal_type, abuf_getlen(writer->out));
    return -1;
  }

  /* calculate network ordered size */
  tmp16 = htons(length - 4);

  /* put it into the signal */
  dst = abuf_getptr(writer->out);
  memcpy(&dst[writer->signal_start + 2], &tmp16, sizeof(tmp16));

  OONF_DEBUG_HEX(source, &dst[writer->signal_start], length, "Finished signal %u:", writer->signal_type);
  return 0;
}